

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Annotation.cpp
# Opt level: O1

void __thiscall soul::Annotation::set(Annotation *this,string *name,ValueView *value)

{
  MainType MVar1;
  pointer pcVar2;
  StringDictionary *pSVar3;
  int iVar4;
  undefined4 extraout_var;
  long extraout_RDX;
  char *errorMessage;
  string local_58;
  string local_38;
  
  MVar1 = (value->type).mainType;
  if (MVar1 < float32) {
    if (MVar1 == boolean) {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      pcVar2 = (name->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar2,pcVar2 + name->_M_string_length);
      if ((value->type).mainType != boolean) {
        choc::value::throwError("Value is not a bool");
      }
      set(this,&local_58,*value->data != '\0');
    }
    else if (MVar1 == int32) {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      pcVar2 = (name->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar2,pcVar2 + name->_M_string_length);
      if ((value->type).mainType != int32) {
        choc::value::throwError("Value is not an int32");
      }
      set(this,&local_58,*(int32_t *)value->data);
    }
    else {
      if (MVar1 != int64) {
LAB_001c4037:
        throwInternalCompilerError("set",0xdb);
      }
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      pcVar2 = (name->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar2,pcVar2 + name->_M_string_length);
      if ((value->type).mainType != int64) {
        choc::value::throwError("Value is not an int64");
      }
      set(this,&local_58,*(int64_t *)value->data);
    }
  }
  else if (MVar1 == float32) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    pcVar2 = (name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar2,pcVar2 + name->_M_string_length);
    if ((value->type).mainType != float32) {
      choc::value::throwError("Value is not a float32");
    }
    set(this,&local_58,*(float *)value->data);
  }
  else {
    if (MVar1 != float64) {
      if (MVar1 != string) goto LAB_001c4037;
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      pcVar2 = (name->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar2,pcVar2 + name->_M_string_length);
      pSVar3 = value->stringDictionary;
      if (pSVar3 == (StringDictionary *)0x0) {
        errorMessage = "No string dictionary supplied";
      }
      else {
        if ((value->type).mainType == string) {
          iVar4 = (*pSVar3->_vptr_StringDictionary[3])(pSVar3,(ulong)*(uint *)value->data);
          local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_38,extraout_RDX,CONCAT44(extraout_var,iVar4) + extraout_RDX);
          set(this,&local_58,&local_38);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_38._M_dataplus._M_p != &local_38.field_2) {
            operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
          }
          goto LAB_001c3fc6;
        }
        errorMessage = "Value is not a string";
      }
      choc::value::throwError(errorMessage);
    }
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    pcVar2 = (name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar2,pcVar2 + name->_M_string_length);
    if ((value->type).mainType != float64) {
      choc::value::throwError("Value is not a float64");
    }
    set(this,&local_58,*(double *)value->data);
  }
LAB_001c3fc6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Annotation::set (const std::string& name, const choc::value::ValueView& value)
{
    if (value.isInt32())    return set (std::string (name), value.getInt32());
    if (value.isInt64())    return set (std::string (name), value.getInt64());
    if (value.isFloat32())  return set (std::string (name), value.getFloat32());
    if (value.isFloat64())  return set (std::string (name), value.getFloat64());
    if (value.isBool())     return set (std::string (name), value.getBool());
    if (value.isString())   return set (std::string (name), std::string (value.getString()));

    SOUL_ASSERT_FALSE; // other types not currently handled..
}